

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O2

void find_median<signed_char>
               (vector<signed_char,_std::allocator<signed_char>_> *numbers,VectorData *vd)

{
  char cVar1;
  const_reference pvVar2;
  ulong __n;
  vector<signed_char,_std::allocator<signed_char>_> numbers_copy;
  _Vector_base<signed_char,_std::allocator<signed_char>_> local_38;
  
  if ((long)(numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
            super__Vector_impl_data._M_start == 1) {
    pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::at(numbers,0);
    vd->median = (double)(int)*pvVar2;
  }
  else {
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              ((vector<signed_char,_std::allocator<signed_char>_> *)&local_38,numbers);
    std::
    __sort<__gnu_cxx::__normal_iterator<signed_char*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_38._M_impl.super__Vector_impl_data._M_start,
               local_38._M_impl.super__Vector_impl_data._M_finish);
    __n = (ulong)((long)(numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) >> 1;
    pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::at(numbers,__n);
    vd->median = (double)(int)*pvVar2;
    if ((*(int *)&(numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
         *(int *)&(numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                  super__Vector_impl_data._M_start & 1U) == 0) {
      pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::at(numbers,__n);
      cVar1 = *pvVar2;
      pvVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::at(numbers,__n - 1);
      vd->median = ((double)(int)*pvVar2 + (double)(int)cVar1) * 0.5;
    }
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void find_median(const std::vector<Number>& numbers,
	VectorData& vd)
{
	if (numbers.size() == 1)
	{
		vd.median = numbers.at(0);
		return;
	}

	std::vector<Number> numbers_copy(numbers);
	std::sort(numbers_copy.begin(), numbers_copy.end());

	size_t pos = numbers.size() / 2;
	vd.median = numbers.at(pos);

	if (numbers.size() % 2 == 0)
	{
		double upper = numbers.at(pos);
		double lower = numbers.at(pos - 1);
		vd.median = (upper + lower) / 2.0;
	}
}